

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObservation.h
# Opt level: O3

double __thiscall CEObservation::GetZenith_Rad(CEObservation *this)

{
  double dVar1;
  undefined1 local_60 [80];
  
  UpdateCoordinates(this);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate((CEDate *)(local_60 + 0x10),dVar1,JD);
  CESkyCoord::YCoord((CESkyCoord *)local_60,(CEDate *)&this->cached_coords_);
  dVar1 = CEAngle::Rad((CEAngle *)local_60);
  CEAngle::~CEAngle((CEAngle *)local_60);
  CEDate::~CEDate((CEDate *)(local_60 + 0x10));
  return dVar1;
}

Assistant:

inline
double CEObservation::GetZenith_Rad()
{
    UpdateCoordinates();
    return cached_coords_.YCoord().Rad();
}